

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall libcellml::Model::removeAllUnits(Model *this)

{
  undefined8 *puVar1;
  UnitsImpl *this_00;
  EntityImpl *pEVar2;
  shared_ptr<libcellml::Units> *u;
  undefined8 *puVar3;
  
  pEVar2 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  puVar3 = (undefined8 *)pEVar2[4].mId._M_string_length;
  puVar1 = (undefined8 *)pEVar2[4].mId.field_2._M_allocated_capacity;
  if (puVar3 != puVar1) {
    do {
      this_00 = Units::pFunc((Units *)*puVar3);
      ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
      puVar3 = puVar3 + 2;
    } while (puVar3 != puVar1);
    pEVar2 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             mPimpl;
  }
  std::
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
  clear((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
         *)&pEVar2[4].mId._M_string_length);
  return;
}

Assistant:

void Model::removeAllUnits()
{
    for (const auto &u : pFunc()->mUnits) {
        u->pFunc()->removeParent();
    }
    pFunc()->mUnits.clear();
}